

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void MOJOSHADER_freeParseData(MOJOSHADER_parseData *_data)

{
  void *d_00;
  MOJOSHADER_free local_38;
  int local_2c;
  int i;
  void *d;
  MOJOSHADER_free f;
  MOJOSHADER_parseData *data;
  MOJOSHADER_parseData *_data_local;
  
  if ((_data != (MOJOSHADER_parseData *)0x0) && (_data != &MOJOSHADER_out_of_mem_data)) {
    if (_data->free == (MOJOSHADER_free)0x0) {
      local_38 = MOJOSHADER_internal_free;
    }
    else {
      local_38 = _data->free;
    }
    d_00 = _data->malloc_data;
    (*local_38)(_data->mainfn,d_00);
    (*local_38)(_data->output,d_00);
    (*local_38)(_data->constants,d_00);
    (*local_38)(_data->swizzles,d_00);
    for (local_2c = 0; local_2c < _data->error_count; local_2c = local_2c + 1) {
      (*local_38)(_data->errors[local_2c].error,d_00);
      (*local_38)(_data->errors[local_2c].filename,d_00);
    }
    (*local_38)(_data->errors,d_00);
    for (local_2c = 0; local_2c < _data->uniform_count; local_2c = local_2c + 1) {
      (*local_38)(_data->uniforms[local_2c].name,d_00);
    }
    (*local_38)(_data->uniforms,d_00);
    for (local_2c = 0; local_2c < _data->attribute_count; local_2c = local_2c + 1) {
      (*local_38)(_data->attributes[local_2c].name,d_00);
    }
    (*local_38)(_data->attributes,d_00);
    for (local_2c = 0; local_2c < _data->output_count; local_2c = local_2c + 1) {
      (*local_38)(_data->outputs[local_2c].name,d_00);
    }
    (*local_38)(_data->outputs,d_00);
    for (local_2c = 0; local_2c < _data->sampler_count; local_2c = local_2c + 1) {
      (*local_38)(_data->samplers[local_2c].name,d_00);
    }
    (*local_38)(_data->samplers,d_00);
    free_symbols(local_38,d_00,_data->symbols,_data->symbol_count);
    MOJOSHADER_freePreshader(_data->preshader);
    (*local_38)(_data,d_00);
  }
  return;
}

Assistant:

void MOJOSHADER_freeParseData(const MOJOSHADER_parseData *_data)
{
    MOJOSHADER_parseData *data = (MOJOSHADER_parseData *) _data;
    if ((data == NULL) || (data == &MOJOSHADER_out_of_mem_data))
        return;  // no-op.

    MOJOSHADER_free f = (data->free == NULL) ? MOJOSHADER_internal_free : data->free;
    void *d = data->malloc_data;
    int i;

    // we don't f(data->profile), because that's internal static data.

    f((void *) data->mainfn, d);
    f((void *) data->output, d);
    f((void *) data->constants, d);
    f((void *) data->swizzles, d);

    for (i = 0; i < data->error_count; i++)
    {
        f((void *) data->errors[i].error, d);
        f((void *) data->errors[i].filename, d);
    } // for
    f((void *) data->errors, d);

    for (i = 0; i < data->uniform_count; i++)
        f((void *) data->uniforms[i].name, d);
    f((void *) data->uniforms, d);

    for (i = 0; i < data->attribute_count; i++)
        f((void *) data->attributes[i].name, d);
    f((void *) data->attributes, d);

    for (i = 0; i < data->output_count; i++)
        f((void *) data->outputs[i].name, d);
    f((void *) data->outputs, d);

    for (i = 0; i < data->sampler_count; i++)
        f((void *) data->samplers[i].name, d);
    f((void *) data->samplers, d);

    free_symbols(f, d, data->symbols, data->symbol_count);
    MOJOSHADER_freePreshader(data->preshader);

    f(data, d);
}